

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Scanner::getRelevantTypes(wasm::Type_
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,void *this,
          Type type)

{
  iterator __position;
  char cVar1;
  Nullability NVar2;
  Type type_00;
  initializer_list<wasm::Type> __l;
  undefined1 auVar3 [16];
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_58;
  Type local_40;
  pointer local_38;
  Type type_local;
  HeapType heapType;
  
  local_38 = (pointer)this;
  cVar1 = wasm::Type::isRef();
  if (cVar1 == '\0') {
    local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = local_38;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_58;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (__return_storage_ptr__,__l,(allocator_type *)&type_local);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type_local.id = wasm::Type::getHeapType();
    NVar2 = wasm::Type::getNullability();
    if (NVar2 == NonNullable) {
      wasm::Type::Type(&local_40,(HeapType)type_local.id,Nullable);
      Type_(&local_58,(void *)local_40.id,type_00);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_move_assign
                (__return_storage_ptr__,&local_58);
      if (local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    do {
      wasm::Type::Type((Type *)&local_58,(HeapType)type_local.id,NVar2);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                  (__return_storage_ptr__,__position,(Type *)&local_58);
      }
      else {
        (__position._M_current)->id =
             (uintptr_t)
             local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      auVar3 = wasm::HeapType::getSuperType();
      type_local.id = auVar3._0_8_;
    } while ((auVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> getRelevantTypes(Type type) {
      // Given an expression of a type, we can replace not only other
      // expressions with the same type, but also supertypes - since then we'd
      // be replacing with a subtype, which is valid.
      if (!type.isRef()) {
        return {type};
      }

      std::vector<Type> ret;
      auto heapType = type.getHeapType();
      auto nullability = type.getNullability();

      if (nullability == NonNullable) {
        ret = getRelevantTypes(Type(heapType, Nullable));
      }

      while (1) {
        ret.push_back(Type(heapType, nullability));
        // TODO: handle basic supertypes too
        auto super = heapType.getSuperType();
        if (!super) {
          break;
        }
        heapType = *super;
      }

      return ret;
    }